

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

token_vector * cpptempl::tokenize(string *text,token_vector *tokens)

{
  char cVar1;
  size_type sVar2;
  vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>> *pvVar3;
  TokenVar *__p;
  bool bVar4;
  long lVar5;
  TokenText *pTVar6;
  TokenFor *this;
  TokenIf *this_00;
  TokenEnd *this_01;
  string *psVar7;
  allocator local_1a9;
  vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
  *local_1a8;
  string expression;
  string local_180;
  TokenVar *local_160;
  string pre_text;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_1a8 = (vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
               *)tokens;
  do {
    if (text->_M_string_length == 0) {
      return (token_vector *)local_1a8;
    }
    lVar5 = std::__cxx11::string::find((char *)text,0x206284);
    if (lVar5 == -1) {
      if (text->_M_string_length == 0) {
        return (token_vector *)local_1a8;
      }
      pTVar6 = (TokenText *)operator_new(0x28);
      std::__cxx11::string::string((string *)&local_130,(string *)text);
      TokenText::TokenText(pTVar6,&local_130);
      std::__shared_ptr<cpptempl::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<cpptempl::TokenText,void>
                ((__shared_ptr<cpptempl::Token,(__gnu_cxx::_Lock_policy)2> *)&pre_text,pTVar6);
      std::vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
      ::emplace_back<std::shared_ptr<cpptempl::Token>>
                (local_1a8,(shared_ptr<cpptempl::Token> *)&pre_text);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pre_text._M_string_length);
      std::__cxx11::string::~string((string *)&local_130);
      return (token_vector *)local_1a8;
    }
    std::__cxx11::string::substr((ulong)&pre_text,(ulong)text);
    if (pre_text._M_string_length != 0) {
      pTVar6 = (TokenText *)operator_new(0x28);
      std::__cxx11::string::string((string *)&local_50,(string *)&pre_text);
      TokenText::TokenText(pTVar6,&local_50);
      std::__shared_ptr<cpptempl::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<cpptempl::TokenText,void>
                ((__shared_ptr<cpptempl::Token,(__gnu_cxx::_Lock_policy)2> *)&expression,pTVar6);
      std::vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
      ::emplace_back<std::shared_ptr<cpptempl::Token>>
                (local_1a8,(shared_ptr<cpptempl::Token> *)&expression);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&expression._M_string_length);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::substr((ulong)&expression,(ulong)text);
    std::__cxx11::string::operator=((string *)text,(string *)&expression);
    std::__cxx11::string::~string((string *)&expression);
    sVar2 = text->_M_string_length;
    if (sVar2 == 0) {
      pTVar6 = (TokenText *)operator_new(0x28);
      pvVar3 = local_1a8;
      std::__cxx11::string::string((string *)&local_70,"{",(allocator *)&local_180);
      TokenText::TokenText(pTVar6,&local_70);
      std::__shared_ptr<cpptempl::Token,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<cpptempl::TokenText,void>
                ((__shared_ptr<cpptempl::Token,(__gnu_cxx::_Lock_policy)2> *)&expression,pTVar6);
      std::vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
      ::emplace_back<std::shared_ptr<cpptempl::Token>>
                (pvVar3,(shared_ptr<cpptempl::Token> *)&expression);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&expression._M_string_length);
      psVar7 = &local_70;
LAB_001605b4:
      std::__cxx11::string::~string((string *)psVar7);
    }
    else {
      cVar1 = *(text->_M_dataplus)._M_p;
      if (cVar1 == '%') {
        lVar5 = std::__cxx11::string::find((char *)text,0x18d505);
        if (lVar5 != -1) {
          std::__cxx11::string::substr((ulong)&local_180,(ulong)text);
          nonius::trim_copy_if<nonius::detail::is_spaceF>(&expression,&local_180);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::substr((ulong)&local_180,(ulong)text);
          std::__cxx11::string::operator=((string *)text,(string *)&local_180);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::string((string *)&local_180,"for",&local_1a9);
          bVar4 = nonius::starts_with(&expression,&local_180);
          std::__cxx11::string::~string((string *)&local_180);
          if (bVar4) {
            this = (TokenFor *)operator_new(0x60);
            std::__cxx11::string::string((string *)&local_b0,(string *)&expression);
            TokenFor::TokenFor(this,&local_b0);
            std::__shared_ptr<cpptempl::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<cpptempl::TokenFor,void>
                      ((__shared_ptr<cpptempl::Token,(__gnu_cxx::_Lock_policy)2> *)&local_180,this);
            std::
            vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
            ::emplace_back<std::shared_ptr<cpptempl::Token>>
                      (local_1a8,(shared_ptr<cpptempl::Token> *)&local_180);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_180._M_string_length);
            psVar7 = &local_b0;
          }
          else {
            std::__cxx11::string::string((string *)&local_180,"if",&local_1a9);
            bVar4 = nonius::starts_with(&expression,&local_180);
            std::__cxx11::string::~string((string *)&local_180);
            if (bVar4) {
              this_00 = (TokenIf *)operator_new(0x40);
              std::__cxx11::string::string((string *)&local_d0,(string *)&expression);
              TokenIf::TokenIf(this_00,&local_d0);
              std::__shared_ptr<cpptempl::Token,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<cpptempl::TokenIf,void>
                        ((__shared_ptr<cpptempl::Token,(__gnu_cxx::_Lock_policy)2> *)&local_180,
                         this_00);
              std::
              vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
              ::emplace_back<std::shared_ptr<cpptempl::Token>>
                        (local_1a8,(shared_ptr<cpptempl::Token> *)&local_180);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_180._M_string_length);
              psVar7 = &local_d0;
            }
            else {
              this_01 = (TokenEnd *)operator_new(0x28);
              nonius::trim_copy_if<nonius::detail::is_spaceF>(&local_f0,&expression);
              TokenEnd::TokenEnd(this_01,&local_f0);
              std::__shared_ptr<cpptempl::Token,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<cpptempl::TokenEnd,void>
                        ((__shared_ptr<cpptempl::Token,(__gnu_cxx::_Lock_policy)2> *)&local_180,
                         this_01);
              std::
              vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
              ::emplace_back<std::shared_ptr<cpptempl::Token>>
                        (local_1a8,(shared_ptr<cpptempl::Token> *)&local_180);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_180._M_string_length);
              psVar7 = &local_f0;
            }
          }
          std::__cxx11::string::~string((string *)psVar7);
LAB_001606be:
          std::__cxx11::string::~string((string *)&expression);
        }
      }
      else {
        if (cVar1 != '$') {
          pTVar6 = (TokenText *)operator_new(0x28);
          pvVar3 = local_1a8;
          std::__cxx11::string::string((string *)&local_110,"{",(allocator *)&local_180);
          TokenText::TokenText(pTVar6,&local_110);
          std::__shared_ptr<cpptempl::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<cpptempl::TokenText,void>
                    ((__shared_ptr<cpptempl::Token,(__gnu_cxx::_Lock_policy)2> *)&expression,pTVar6)
          ;
          std::
          vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
          ::emplace_back<std::shared_ptr<cpptempl::Token>>
                    (pvVar3,(shared_ptr<cpptempl::Token> *)&expression);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&expression._M_string_length);
          psVar7 = &local_110;
          goto LAB_001605b4;
        }
        lVar5 = std::__cxx11::string::find((char *)text,0x18d505);
        if (lVar5 != -1) {
          local_160 = (TokenVar *)operator_new(0x28);
          pvVar3 = local_1a8;
          std::__cxx11::string::substr((ulong)&local_90,(ulong)text);
          __p = local_160;
          TokenVar::TokenVar(local_160,&local_90);
          std::__shared_ptr<cpptempl::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<cpptempl::TokenVar,void>
                    ((__shared_ptr<cpptempl::Token,(__gnu_cxx::_Lock_policy)2> *)&expression,__p);
          std::
          vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>
          ::emplace_back<std::shared_ptr<cpptempl::Token>>
                    (pvVar3,(shared_ptr<cpptempl::Token> *)&expression);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&expression._M_string_length);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::substr((ulong)&expression,(ulong)text);
          std::__cxx11::string::operator=((string *)text,(string *)&expression);
          goto LAB_001606be;
        }
      }
    }
    std::__cxx11::string::~string((string *)&pre_text);
    if (sVar2 == 0) {
      return (token_vector *)local_1a8;
    }
  } while( true );
}

Assistant:

inline token_vector & tokenize(std::string text, token_vector &tokens)
    {
        while(! text.empty())
        {
            size_t pos = text.find("{") ;
            if (pos == std::string::npos)
            {
                if (! text.empty())
                {
                    tokens.push_back(token_ptr(new TokenText(text))) ;
                }
                return tokens ;
            }
            std::string pre_text = text.substr(0, pos) ;
            if (! pre_text.empty())
            {
                tokens.push_back(token_ptr(new TokenText(pre_text))) ;
            }
            text = text.substr(pos+1) ;
            if (text.empty())
            {
                tokens.push_back(token_ptr(new TokenText("{"))) ;
                return tokens ;
            }

            // variable
            if (text[0] == '$')
            {
                pos = text.find("}") ;
                if (pos != std::string::npos)
                {
                    tokens.push_back(token_ptr (new TokenVar(text.substr(1, pos-1)))) ;
                    text = text.substr(pos+1) ;
                }
            }
            // control statement
            else if (text[0] == '%')
            {
                pos = text.find("}") ;
                if (pos != std::string::npos)
                {
                    std::string expression = nonius::trim_copy(text.substr(1, pos-2)) ;
                    text = text.substr(pos+1) ;
                    if (nonius::starts_with(expression, "for"))
                    {
                        tokens.push_back(token_ptr (new TokenFor(expression))) ;
                    }
                    else if (nonius::starts_with(expression, "if"))
                    {
                        tokens.push_back(token_ptr (new TokenIf(expression))) ;
                    }
                    else
                    {
                        tokens.push_back(token_ptr (new TokenEnd(nonius::trim_copy(expression)))) ;
                    }
                }
            }
            else
            {
                tokens.push_back(token_ptr(new TokenText("{"))) ;
            }
        }
        return tokens ;
    }